

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int hkdf_expand_label(ptls_hash_algorithm_t *algo,void *output,size_t outlen,ptls_iovec_t secret,
                     char *label,ptls_iovec_t hash_value,char *label_prefix)

{
  ptls_iovec_t prk;
  ptls_hash_algorithm_t *algo_00;
  ptls_buffer_t *in_RDX;
  char *in_R9;
  char *in_stack_00000018;
  size_t body_size_1;
  size_t body_start_1;
  size_t capacity_1;
  size_t body_size;
  size_t body_start;
  size_t capacity;
  uint16_t _v;
  int ret;
  uint8_t hkdf_label_buf [80];
  ptls_buffer_t hkdf_label;
  void *in_stack_fffffffffffffeb8;
  ptls_buffer_t *in_stack_fffffffffffffec0;
  ptls_buffer_t *in_stack_fffffffffffffec8;
  size_t in_stack_fffffffffffffed0;
  ptls_buffer_t *in_stack_fffffffffffffed8;
  ptls_buffer_t *in_stack_fffffffffffffee0;
  uint8_t *outlen_00;
  void *output_00;
  uint8_t *puVar1;
  size_t sVar2;
  int local_ac;
  ptls_iovec_t in_stack_ffffffffffffff60;
  void *local_50;
  uint8_t *local_40;
  
  if (in_stack_00000018 == (char *)0x0) {
    __assert_fail("label_prefix != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                  ,0x1431,
                  "int hkdf_expand_label(ptls_hash_algorithm_t *, void *, size_t, ptls_iovec_t, const char *, ptls_iovec_t, const char *)"
                 );
  }
  ptls_buffer_init(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,0x1113a2);
  local_ac = ptls_buffer__do_pushv
                       (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                        (size_t)in_stack_fffffffffffffeb8);
  if (local_ac == 0) {
    sVar2 = 1;
    local_ac = ptls_buffer__do_pushv
                         (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                          (size_t)in_stack_fffffffffffffeb8);
    if (local_ac == 0) {
      puVar1 = local_40;
      strlen(in_stack_00000018);
      local_ac = ptls_buffer__do_pushv
                           (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                            (size_t)in_stack_fffffffffffffeb8);
      if (local_ac == 0) {
        strlen(in_R9);
        local_ac = ptls_buffer__do_pushv
                             (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                              (size_t)in_stack_fffffffffffffeb8);
        if (local_ac == 0) {
          algo_00 = (ptls_hash_algorithm_t *)(local_40 + -(long)puVar1);
          if (sVar2 == 0xffffffffffffffff) {
            local_ac = ptls_buffer__adjust_quic_blocksize
                                 (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
            if (local_ac != 0) goto LAB_0011174f;
          }
          else {
            for (; sVar2 != 0; sVar2 = sVar2 - 1) {
              *(char *)((long)local_50 + ((long)puVar1 - sVar2)) =
                   (char)((ulong)algo_00 >> (((char)sVar2 + -1) * '\b' & 0x3fU));
            }
            sVar2 = 0;
          }
          output_00 = (void *)0x1;
          local_ac = ptls_buffer__do_pushv
                               (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                                (size_t)in_stack_fffffffffffffeb8);
          if ((local_ac == 0) &&
             (outlen_00 = local_40,
             local_ac = ptls_buffer__do_pushv
                                  (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                                   (size_t)in_stack_fffffffffffffeb8), local_ac == 0)) {
            if (output_00 == (void *)0xffffffffffffffff) {
              local_ac = ptls_buffer__adjust_quic_blocksize
                                   (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
              if (local_ac != 0) goto LAB_0011174f;
            }
            else {
              for (; output_00 != (void *)0x0; output_00 = (void *)((long)output_00 + -1)) {
                *(char *)((long)local_50 + ((long)outlen_00 - (long)output_00)) =
                     (char)((ulong)((long)local_40 - (long)outlen_00) >>
                           (((char)output_00 + -1) * '\b' & 0x3fU));
              }
              output_00 = (void *)0x0;
            }
            ptls_iovec_init(local_50,(size_t)local_40);
            prk.len = sVar2;
            prk.base = puVar1;
            local_ac = ptls_hkdf_expand(algo_00,output_00,(size_t)outlen_00,prk,
                                        in_stack_ffffffffffffff60);
            in_stack_fffffffffffffee0 = in_RDX;
          }
        }
      }
    }
  }
LAB_0011174f:
  ptls_buffer_dispose(in_stack_fffffffffffffee0);
  return local_ac;
}

Assistant:

int hkdf_expand_label(ptls_hash_algorithm_t *algo, void *output, size_t outlen, ptls_iovec_t secret, const char *label,
                      ptls_iovec_t hash_value, const char *label_prefix)
{
    ptls_buffer_t hkdf_label;
    uint8_t hkdf_label_buf[80];
    int ret;

    assert(label_prefix != NULL);

    ptls_buffer_init(&hkdf_label, hkdf_label_buf, sizeof(hkdf_label_buf));

    ptls_buffer_push16(&hkdf_label, (uint16_t)outlen);
    ptls_buffer_push_block(&hkdf_label, 1, {
        ptls_buffer_pushv(&hkdf_label, label_prefix, strlen(label_prefix));
        ptls_buffer_pushv(&hkdf_label, label, strlen(label));
    });
    ptls_buffer_push_block(&hkdf_label, 1, { ptls_buffer_pushv(&hkdf_label, hash_value.base, hash_value.len); });

    ret = ptls_hkdf_expand(algo, output, outlen, secret, ptls_iovec_init(hkdf_label.base, hkdf_label.off));

Exit:
    ptls_buffer_dispose(&hkdf_label);
    return ret;
}